

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree_iterators.h
# Opt level: O0

void __thiscall
Gudhi::
Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>::
increment(Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>
          *this)

{
  Simplex_tree<Gudhi::Simplex_tree_options_default> *this_00;
  bool bVar1;
  Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
  *pSVar2;
  Dictionary *x;
  pointer ppVar3;
  Siblings *pSVar4;
  flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>
  local_38;
  undefined1 local_20 [16];
  Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>
  *local_10;
  Simplex_tree_complex_simplex_iterator<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>
  *this_local;
  
  local_10 = this;
  boost::container::
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  ::operator++(&this->sh_);
  Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
  ::members(this->sib_);
  boost::container::
  flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>
  ::end((flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>
         *)(local_20 + 8));
  bVar1 = boost::container::operator==
                    (&this->sh_,
                     (vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
                      *)(local_20 + 8));
  if (bVar1) {
    pSVar2 = Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
             ::oncles(this->sib_);
    if (pSVar2 == (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
                   *)0x0) {
      this->st_ = (Simplex_tree<Gudhi::Simplex_tree_options_default> *)0x0;
    }
    else {
      pSVar2 = Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
               ::oncles(this->sib_);
      x = Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
          ::members(pSVar2);
      local_38.m_flat_tree.m_data.m_seq.m_holder.m_capacity._4_4_ =
           Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
           ::parent(this->sib_);
      boost::container::
      flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>
      ::find((flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>
              *)local_20,(key_type_conflict *)x);
      boost::container::
      vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
      ::operator=(&this->sh_,
                  (vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
                   *)local_20);
      pSVar2 = Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
               ::oncles(this->sib_);
      this->sib_ = pSVar2;
    }
  }
  else {
    while( true ) {
      this_00 = this->st_;
      boost::container::
      vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
      ::vec_iterator((vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
                      *)&local_38.m_flat_tree.m_data.m_seq.m_holder.m_size,&this->sh_);
      bVar1 = Simplex_tree<Gudhi::Simplex_tree_options_default>::
              has_children<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>>
                        (this_00,(vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
                                  *)&local_38.m_flat_tree.m_data.m_seq.m_holder.m_size);
      if (!bVar1) break;
      ppVar3 = boost::container::
               vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
               ::operator->(&this->sh_);
      pSVar4 = Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>
               ::children(&ppVar3->second);
      this->sib_ = pSVar4;
      Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
      ::members(this->sib_);
      boost::container::
      flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>
      ::begin(&local_38);
      boost::container::
      vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
      ::operator=(&this->sh_,
                  (vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
                   *)&local_38);
    }
  }
  return;
}

Assistant:

void increment() {
    ++sh_;
    if (sh_ == sib_->members().end()) {
      if (sib_->oncles() == nullptr) {
        st_ = nullptr;
        return;
      }  // reach the end
      sh_ = sib_->oncles()->members().find(sib_->parent());
      sib_ = sib_->oncles();
      return;
    }
    while (st_->has_children(sh_)) {
      sib_ = sh_->second.children();
      sh_ = sib_->members().begin();
    }
  }